

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yin_print_typerestr(lyout *out,int level,lys_module *module,lys_restr *restr,char *elem_name)

{
  char *attr_value;
  int local_34 [2];
  int content;
  
  local_34[0] = 0;
  attr_value = restr->expr;
  if ((*attr_value == '\x15') || (*attr_value == '\x06')) {
    attr_value = attr_value + 1;
  }
  yin_print_open(out,level,(char *)0x0,elem_name,"value",attr_value,0);
  yin_print_restr(out,level + 1,module,restr,local_34);
  yin_print_close(out,level,(char *)0x0,elem_name,local_34[0]);
  return;
}

Assistant:

static void
yin_print_typerestr(struct lyout *out, int level, const struct lys_module *module,
                    const struct lys_restr *restr, const char *elem_name)
{
    int content = 0;
    int pattern = 0;

    if (restr->expr[0] == 0x06 || restr->expr[0] == 0x15) {
        pattern = 1;
    }

    yin_print_open(out, level, NULL, elem_name, "value", pattern ? &restr->expr[1] : restr->expr , content);
    yin_print_restr(out, level + 1, module, restr, &content);
    yin_print_close(out, level, NULL, elem_name, content);
}